

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O2

void __thiscall re2c::RuleOp::display(RuleOp *this,ostream *o)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<void_const*>(o);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,";");
  return;
}

Assistant:

void RuleOp::display (std::ostream & o) const
{
	o << exp << "/" << ctx << ";";
}